

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRevolvedAreaSolid::IfcRevolvedAreaSolid(IfcRevolvedAreaSolid *this)

{
  IfcRevolvedAreaSolid *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcRevolvedAreaSolid");
  IfcSweptAreaSolid::IfcSweptAreaSolid
            (&this->super_IfcSweptAreaSolid,&PTR_construction_vtable_24__00f13190);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRevolvedAreaSolid,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRevolvedAreaSolid,_2UL> *)
             &(this->super_IfcSweptAreaSolid).field_0x50,&PTR_construction_vtable_24__00f13240);
  (this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf130b0;
  *(undefined8 *)&this->field_0x70 = 0xf13178;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf130d8;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf13100;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x30 = 0xf13128;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x50 = 0xf13150;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis1Placement>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis1Placement> *)
             &(this->super_IfcSweptAreaSolid).field_0x60,(LazyObject *)0x0);
  return;
}

Assistant:

IfcRevolvedAreaSolid() : Object("IfcRevolvedAreaSolid") {}